

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapper,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t)>
               (interval_t *adata,timestamp_t *bdata,interval_t *cdata,timestamp_t *result_data,
               idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,
               _func_timestamp_t_interval_t_timestamp_t_interval_t *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  unsigned_long *puVar5;
  undefined4 uVar8;
  undefined4 uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ulong uVar13;
  timestamp_t tVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  ulong uVar17;
  ulong uVar18;
  idx_t idx_in_entry;
  ulong uVar19;
  interval_t iVar20;
  interval_t iVar21;
  interval_t iVar22;
  interval_t iVar23;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  timestamp_t *local_40;
  idx_t local_38;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    if (count != 0) {
      uVar19 = 0;
      do {
        uVar13 = uVar19;
        if (asel->sel_vector != (sel_t *)0x0) {
          uVar13 = (ulong)asel->sel_vector[uVar19];
        }
        uVar17 = uVar19;
        if (bsel->sel_vector != (sel_t *)0x0) {
          uVar17 = (ulong)bsel->sel_vector[uVar19];
        }
        uVar18 = uVar19;
        if (csel->sel_vector != (sel_t *)0x0) {
          uVar18 = (ulong)csel->sel_vector[uVar19];
        }
        uVar1 = adata[uVar13].months;
        uVar6 = adata[uVar13].days;
        iVar20.days = uVar6;
        iVar20.months = uVar1;
        uVar2 = cdata[uVar18].months;
        uVar7 = cdata[uVar18].days;
        iVar22.days = uVar7;
        iVar22.months = uVar2;
        iVar20.micros = adata[uVar13].micros;
        iVar22.micros = cdata[uVar18].micros;
        tVar14 = (*fun)(iVar20,bdata[uVar17].value,iVar22);
        result_data[uVar19].value = tVar14.value;
        uVar19 = uVar19 + 1;
      } while (count != uVar19);
    }
  }
  else if (count != 0) {
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar19 = 0;
    local_40 = bdata;
    do {
      uVar13 = uVar19;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)asel->sel_vector[uVar19];
      }
      uVar17 = uVar19;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar17 = (ulong)bsel->sel_vector[uVar19];
      }
      uVar18 = uVar19;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar18 = (ulong)csel->sel_vector[uVar19];
      }
      puVar5 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0))
          && ((puVar5 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0))
             )) && ((puVar5 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                    puVar5 == (unsigned_long *)0x0 ||
                    ((puVar5[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)))) {
        uVar3 = adata[uVar13].months;
        uVar8 = adata[uVar13].days;
        iVar21.days = uVar8;
        iVar21.months = uVar3;
        uVar4 = cdata[uVar18].months;
        uVar9 = cdata[uVar18].days;
        iVar23.days = uVar9;
        iVar23.months = uVar4;
        iVar21.micros = adata[uVar13].micros;
        iVar23.micros = cdata[uVar18].micros;
        tVar14 = (*fun)(iVar21,bdata[uVar17].value,iVar23);
        result_data[uVar19].value = tVar14.value;
      }
      else {
        _Var16._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var16._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var12 = p_Stack_50;
          peVar11 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar11;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var12;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          _Var16._M_head_impl =
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var16._M_head_impl;
          bdata = local_40;
        }
        bVar10 = (byte)uVar19 & 0x3f;
        _Var16._M_head_impl[uVar19 >> 6] =
             _Var16._M_head_impl[uVar19 >> 6] &
             (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
      }
      uVar19 = uVar19 + 1;
    } while (count != uVar19);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}